

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.hpp
# Opt level: O3

bool __thiscall
Diligent::RenderPassCache::RenderPassCacheKey::operator==
          (RenderPassCacheKey *this,RenderPassCacheKey *rhs)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  sVar2 = GetHash(this);
  sVar3 = GetHash(rhs);
  if ((((sVar2 == sVar3) && (bVar1 = this->NumRenderTargets, bVar1 == rhs->NumRenderTargets)) &&
      (this->SampleCount == rhs->SampleCount)) &&
     (((this->EnableVRS == rhs->EnableVRS && (this->DSVFormat == rhs->DSVFormat)) &&
      (this->ReadOnlyDSV == rhs->ReadOnlyDSV)))) {
    if ((ulong)bVar1 == 0) {
      bVar5 = true;
    }
    else {
      lVar4 = 0;
      do {
        bVar5 = this->RTVFormats[lVar4] == rhs->RTVFormats[lVar4];
        if (!bVar5) {
          return bVar5;
        }
        bVar6 = (ulong)bVar1 - 1 != lVar4;
        lVar4 = lVar4 + 1;
      } while (bVar6);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool operator==(const RenderPassCacheKey& rhs) const noexcept
        {
            // clang-format off
            if (GetHash()        != rhs.GetHash()        ||
                NumRenderTargets != rhs.NumRenderTargets ||
                SampleCount      != rhs.SampleCount      ||
                EnableVRS        != rhs.EnableVRS        ||
                DSVFormat        != rhs.DSVFormat        ||
                ReadOnlyDSV      != rhs.ReadOnlyDSV)
            {
                return false;
            }
            // clang-format on

            for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
                if (RTVFormats[rt] != rhs.RTVFormats[rt])
                    return false;

            return true;
        }